

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

EVP_PKEY * EVP_parse_public_key(CBS *cbs)

{
  _func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  EVP_PKEY *__p;
  pointer peVar5;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_60;
  UniquePtr<EVP_PKEY> ret;
  EVP_PKEY_ASN1_METHOD *method;
  undefined1 local_48 [7];
  uint8_t padding;
  CBS key;
  CBS algorithm;
  CBS spki;
  CBS *cbs_local;
  
  iVar3 = CBS_get_asn1(cbs,(CBS *)&algorithm.len,0x20000010);
  if ((((iVar3 == 0) ||
       (iVar3 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)&key.len,0x20000010), iVar3 == 0)) ||
      (iVar3 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)local_48,3), iVar3 == 0)) ||
     (sVar4 = CBS_len((CBS *)&algorithm.len), sVar4 != 0)) {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,0x40);
    return (EVP_PKEY *)0x0;
  }
  ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       parse_key_type((CBS *)&key.len);
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
      ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    ERR_put_error(6,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,0x45);
    return (EVP_PKEY *)0x0;
  }
  iVar3 = CBS_get_u8((CBS *)local_48,(uint8_t *)((long)&method + 7));
  if ((iVar3 != 0) && (method._7_1_ == '\0')) {
    __p = EVP_PKEY_new();
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_60,(pointer)__p);
    bVar2 = std::operator==(&local_60,(nullptr_t)0x0);
    if (bVar2) {
      cbs_local = (CBS *)0x0;
    }
    else {
      peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_60);
      evp_pkey_set_method(peVar5,(EVP_PKEY_ASN1_METHOD *)
                                 ret._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator->(&local_60);
      if (peVar5->ameth->pub_decode == (_func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *)0x0) {
        ERR_put_error(6,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                      ,0x59);
        cbs_local = (CBS *)0x0;
      }
      else {
        peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator->(&local_60);
        p_Var1 = peVar5->ameth->pub_decode;
        peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_60);
        iVar3 = (*p_Var1)(peVar5,(CBS *)&key.len,(CBS *)local_48);
        if (iVar3 == 0) {
          cbs_local = (CBS *)0x0;
        }
        else {
          cbs_local = (CBS *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::release
                                       (&local_60);
        }
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
    return (EVP_PKEY *)cbs_local;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                ,0x4c);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_parse_public_key(CBS *cbs) {
  // Parse the SubjectPublicKeyInfo.
  CBS spki, algorithm, key;
  uint8_t padding;
  if (!CBS_get_asn1(cbs, &spki, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &key, CBS_ASN1_BITSTRING) ||
      CBS_len(&spki) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (// Every key type defined encodes the key as a byte string with the same
      // conversion to BIT STRING.
      !CBS_get_u8(&key, &padding) ||
      padding != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific SPKI decoding function.
  if (ret->ameth->pub_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->pub_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}